

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hold_ptr.h
# Opt level: O0

void __thiscall
booster::hold_ptr<cppcms::views::manager::data>::~hold_ptr
          (hold_ptr<cppcms::views::manager::data> *this)

{
  void *pvVar1;
  data *in_RDI;
  
  if ((*(long *)in_RDI != 0) && (pvVar1 = *(void **)in_RDI, pvVar1 != (void *)0x0)) {
    cppcms::views::manager::data::~data(in_RDI);
    operator_delete(pvVar1);
  }
  return;
}

Assistant:

~hold_ptr() 
		{
			if(ptr_) delete ptr_;
		}